

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

void dxil_spv::emit_buffer_synchronization_validation
               (Impl *impl,CallInst *instruction,BDAOperation bda_operation)

{
  uint32_t *puVar1;
  StorageClass storage;
  uint uVar2;
  code *pcVar3;
  Op op;
  undefined3 uVar4;
  iterator puVar5;
  Builder *this;
  bool bVar6;
  byte bVar7;
  char cVar8;
  byte bVar9;
  char cVar10;
  Id IVar11;
  ValueKind VVar12;
  Id IVar13;
  RawWidth RVar14;
  Id IVar15;
  Id IVar16;
  TypeID TVar17;
  Op OVar18;
  Value *pVVar19;
  Impl *this_00;
  Builder *pBVar20;
  Type *pTVar21;
  Constant *this_01;
  APInt *this_02;
  Builder *pBVar22;
  Operation *pOVar23;
  Operation *pOVar24;
  mapped_type *pmVar25;
  ulong uVar26;
  byte *pbVar27;
  LoggingCallback p_Var28;
  void *pvVar29;
  Impl *pIVar30;
  int *piVar31;
  char *pcVar32;
  Impl *pIVar33;
  uint *puVar34;
  undefined2 uVar35;
  uint uVar36;
  undefined8 extraout_RDX;
  undefined8 uVar37;
  int iVar38;
  undefined8 *puVar39;
  undefined8 *unaff_RBP;
  key_type pVVar40;
  int width;
  Impl *pIVar41;
  char *in_R8;
  char in_R10B;
  ulong uVar42;
  long lVar43;
  uint uVar44;
  Builder *this_03;
  longdouble in_ST0;
  Id image_id;
  undefined8 uStack_1088;
  undefined8 uStack_1078;
  uint uStack_1070;
  undefined4 local_106c;
  undefined8 local_1068;
  undefined8 local_1060;
  Id IStack_1058;
  Id local_1054;
  undefined8 local_1050;
  Impl *local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  Id IStack_1030;
  Id IStack_102c;
  initializer_list<unsigned_int> iStack_1028;
  Id aIStack_1018 [4];
  uint uStack_1008;
  undefined4 uStack_1004;
  undefined8 uStack_1000;
  Id IStack_ff8;
  Id IStack_ff4;
  Vector<spv::Id> VStack_fe8;
  undefined3 uStack_fd0;
  undefined5 uStack_fcd;
  undefined3 uStack_fc8;
  char acStack_fc5 [3989];
  
  bVar9 = 0;
  if ((impl->options).instruction_instrumentation.enabled != true) {
    anon_var_dwarf_28b549[10] = 'B';
    return;
  }
  if ((impl->options).instruction_instrumentation.type != BufferSynchronizationValidation) {
    anon_var_dwarf_28b549[10] = 'B';
    return;
  }
  local_1068 = (Impl *)instruction;
  pVVar19 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar11 = Converter::Impl::get_id_for_value(impl,pVVar19,0);
  uStack_1040 = (Type *)CONCAT44(IVar11,(Id)uStack_1040);
  this_00 = (Impl *)std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&impl->handle_to_resource_meta,
                                 (key_type *)((long)&uStack_1040 + 4));
  if ((*(int *)((long)&(this_00->metas).
                       super__Vector_base<std::unique_ptr<dxil_spv::Converter::Impl::BlockMeta,_std::default_delete<dxil_spv::Converter::Impl::BlockMeta>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::Converter::Impl::BlockMeta,_std::default_delete<dxil_spv::Converter::Impl::BlockMeta>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) != 0x14e5) &&
     (*(int *)((long)&(this_00->bb_map)._M_h._M_before_begin._M_nxt + 4) == 0)) {
    return;
  }
  local_1060 = Converter::Impl::builder(impl);
  local_1050 = (Builder *)CONCAT44(bda_operation,(Id)local_1050);
  if (Store < bda_operation) {
    bVar6 = value_is_dx_op_instrinsic((Value *)local_1068,AtomicCompareExchange);
    pIVar41 = local_1068;
    uVar44 = bVar6 ^ 3;
    cVar10 = *(char *)&this_00->bitcode_parser;
    local_1048 = this_00;
    if (cVar10 == '\n') {
      pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,uVar44);
      local_106c = 0;
      IVar15 = Converter::Impl::get_id_for_value(impl,pVVar19,0);
      IVar11 = (Id)(this_00->bb_map)._M_h._M_element_count;
    }
    else if (cVar10 == '\f') {
      pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,uVar44);
      local_106c = 0;
      IVar15 = Converter::Impl::get_id_for_value(impl,pVVar19,0);
      pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)pIVar41,uVar44 + 1);
      pVVar19 = LLVMBC::Internal::resolve_proxy(pVVar19);
      VVar12 = LLVMBC::Value::get_value_kind(pVVar19);
      if (VVar12 != Undef) {
        pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,uVar44 + 1);
        local_106c = Converter::Impl::get_id_for_value(impl,pVVar19,0);
      }
      pBVar20 = local_1060;
      uVar44 = *(uint *)&this_00->bitcode_reflection_parser;
      IVar11 = spv::Builder::makeIntegerType(local_1060,0x20,false);
      IVar11 = spv::Builder::makeIntConstant(pBVar20,IVar11,uVar44,false);
    }
    else {
      IVar15 = 0;
      local_106c = 0;
      IVar11 = 0;
      if (cVar10 == '\v') {
        pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,uVar44);
        IVar15 = 0;
        local_106c = Converter::Impl::get_id_for_value(impl,pVVar19,0);
        IVar11 = 0;
      }
    }
    pTVar21 = LLVMBC::Value::getType((Value *)local_1068);
    uVar44 = LLVMBC::Type::getIntegerBitWidth(pTVar21);
    pBVar20 = local_1060;
    IVar13 = spv::Builder::makeIntegerType(local_1060,0x20,false);
    IVar13 = spv::Builder::makeIntConstant(pBVar20,IVar13,uVar44 >> 3,false);
    this_00 = local_1048;
    goto LAB_00175909;
  }
  if (bda_operation == Store) {
    pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,4);
    pBVar20 = (Builder *)LLVMBC::Value::getType(pVVar19);
  }
  else {
    pTVar21 = LLVMBC::Value::getType((Value *)local_1068);
    pBVar20 = (Builder *)LLVMBC::Type::getStructElementType(pTVar21,0);
  }
  IVar13 = 0;
  if (1 < (byte)(*(char *)&this_00->bitcode_parser - 0xbU)) goto LAB_00175c14;
  if (bda_operation == Load) {
    local_1038 = local_1068;
    pmVar25 = std::__detail::
              _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->llvm_composite_meta,(key_type *)&local_1038);
    pBVar22 = (Builder *)(ulong)(pmVar25->access_mask & 0xf);
  }
  else {
    pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,8);
    this_01 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar19);
    VVar12 = LLVMBC::Value::get_value_kind((Value *)this_01);
    if (VVar12 != ConstantInt) {
      p_Var28 = get_thread_log_callback();
      if (p_Var28 == (LoggingCallback)0x0) {
        emit_buffer_synchronization_validation();
        std::terminate();
      }
      iStack_1028._M_array._0_4_ = 0x63206e69;
      iStack_1028._M_array._4_4_ = 0x3c747361;
      iStack_1028._M_len._0_4_ = 0xa2e3e54;
      iStack_1028._M_len._4_4_ = iStack_1028._M_len._4_4_ & 0xffffff00;
      local_1038 = (Impl *)0x2064696c61766e49;
      IStack_1030 = 0x65707974;
      IStack_102c = 0x20444920;
      pvVar29 = get_thread_log_callback_userdata();
      (*p_Var28)(pvVar29,Error,(char *)&local_1038);
      std::terminate();
    }
    this_02 = LLVMBC::Constant::getUniqueInteger(this_01);
    pBVar22 = (Builder *)LLVMBC::APInt::getZExtValue(this_02);
  }
  storage = *(StorageClass *)
             ((long)&(this_00->metas).
                     super__Vector_base<std::unique_ptr<dxil_spv::Converter::Impl::BlockMeta,_std::default_delete<dxil_spv::Converter::Impl::BlockMeta>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::Converter::Impl::BlockMeta,_std::default_delete<dxil_spv::Converter::Impl::BlockMeta>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  pOVar23 = (Operation *)(ulong)storage;
  pIVar41 = impl;
  RVar14 = get_buffer_access_bits_per_component(impl,storage,(Type *)pBVar20);
  this_03 = local_1050;
  this = local_1060;
  puVar34 = &switchD_00175bbf::switchdataD_001c77fc;
  uVar26 = (ulong)(int)(&switchD_00175bbf::switchdataD_001c77fc)[(RVar14 & 0xff) * 2];
  pbVar27 = (byte *)((long)&switchD_00175bbf::switchdataD_001c77fc + uVar26);
  width = (int)pOVar23;
  iVar38 = (int)pbVar27;
  bVar7 = (byte)pbVar27;
  uVar37 = extraout_RDX;
  switch(RVar14 & 0xff) {
  case B8:
    __assert_fail("0 && \"Invalid component type.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                  ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
  case B16:
    iVar38 = 0x10;
    break;
  case B32:
    iVar38 = 0x20;
    break;
  case B64:
    iVar38 = 0x40;
    break;
  case Count:
  case Count|B16:
  case Count|B32:
switchD_00175bbf_caseD_4:
    return;
  case Count|B64:
    emit_buffer_load_instruction();
    return;
  case 8:
    cVar10 = (char)pBVar20 * '\x02';
    pBVar20 = (Builder *)CONCAT71((int7)((ulong)pBVar20 >> 8),cVar10 + 1U);
    aIStack_1018[0] = 0;
    aIStack_1018[1] = 0;
    aIStack_1018[2] = 0;
    aIStack_1018[3] = 0;
    uVar44 = (byte)(cVar10 + 1U) - 1;
    uVar35 = (undefined2)extraout_RDX;
    pBVar22 = local_1050;
    if ((int)unaff_RBP != 4) {
      puVar34 = &switchD_001766ba::switchdataD_001c7818;
      piVar31 = (int *)((long)&switchD_001766ba::switchdataD_001c7818 +
                       (long)(int)(&switchD_001766ba::switchdataD_001c7818)[uVar44]);
      cVar8 = (char)piVar31;
      switch(cVar10) {
      case '\0':
        goto switchD_001764a9_caseD_0;
      case '\x02':
        unaff_RBP = (undefined8 *)((ulong)pOVar23 & 0xffffffff);
        goto code_r0x001766be;
      case '\x04':
        iVar38 = 0x20;
        break;
      case '\x06':
        iVar38 = 0x40;
        break;
      default:
        goto switchD_00175bbf_caseD_4;
      case '\x0e':
        uVar44 = (int)piVar31 + *piVar31;
        *(char *)(ulong)uVar44 = *(char *)(ulong)uVar44 + (char)uVar44;
        goto switchD_00175bbf_caseD_c;
      case '\x10':
        out(0x20,(int)piVar31);
        return;
      case '\x12':
        goto switchD_001764a9_caseD_12;
      case '\x14':
        pIVar33 = local_1048;
        goto switchD_001764a9_caseD_18;
      case '\x16':
        puVar39 = (undefined8 *)&stack0xffffffffffffef80;
        cVar10 = '\x03';
        do {
          unaff_RBP = unaff_RBP + -1;
          puVar39 = puVar39 + -1;
          *puVar39 = *unaff_RBP;
          cVar10 = cVar10 + -1;
        } while ('\0' < cVar10);
        goto code_r0x00177f7c;
      case '\x18':
        *(char *)piVar31 = (char)*piVar31 + cVar8;
code_r0x00177f75:
        bVar6 = (Id)local_1050 == 4;
        goto switchD_001764a9_caseD_16;
      case '\x1a':
      case '\x1c':
      case '\x1e':
        goto switchD_00175bbf_caseD_d;
      case ' ':
      case '\"':
        *(char *)&pIVar41->bitcode_parser = (char)pOVar23->op;
        out(uVar35,cVar8);
        (*(code *)0xe566fffa)
                  ((long)pIVar41 + (ulong)bVar9 * -2 + 1,(long)pOVar23 + (ulong)bVar9 * -2 + 1);
        return;
      case '$':
        out(uVar35,cVar8);
code_r0x001c782a:
        (*(code *)(ulong)*(uint *)((long)puVar34 + -10))();
        return;
      case '&':
        pIVar30 = (Impl *)(ulong)((short)piVar31 / (short)in_R10B & 0xff);
        goto code_r0x001c783e;
      case '(':
        (*(code *)&uStack_1078)();
        halt_baddata();
      }
      goto LAB_00176719;
    }
    puVar34 = &switchD_00175bbf::switchdataD_001c7834;
    pIVar30 = (Impl *)((long)&switchD_00175bbf::switchdataD_001c7834 +
                      (long)(int)(&switchD_00175bbf::switchdataD_001c7834)[uVar44]);
    bVar6 = pIVar30 == (Impl *)0x0;
    pIVar33 = pIVar30;
    switch(cVar10) {
    case '\0':
switchD_001764a9_caseD_0:
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    case '\x02':
      iVar38 = 0x10;
      break;
    case '\x04':
      iVar38 = 0x20;
      break;
    case '\x06':
      iVar38 = 0x40;
      break;
    case '\b':
      goto switchD_001764a9_caseD_8;
    case '\n':
      goto code_r0x00177706;
    case '\f':
    case '\x0e':
    case '\x10':
      *(undefined1 *)((long)unaff_RBP + 0x29) = 0;
      LOCK();
      uRam0000000031008316 = 0x1c7834;
      UNLOCK();
      pcVar3 = (code *)swi(0xf8);
      lVar43 = (*pcVar3)();
      *(int *)(lVar43 + -0x73) = *(int *)(lVar43 + -0x73) + -1;
      uStack_1078 = 0x17833f;
      __assert_fail((char *)pIVar41,
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    case '\x12':
switchD_001764a9_caseD_12:
      halt_baddata();
    case '\x14':
      if (bVar6) goto code_r0x00177f4c;
      *(char *)&pIVar30->bitcode_parser = *(char *)&pIVar30->bitcode_parser + (char)pIVar30;
      goto code_r0x00177f4d;
    case '\x16':
switchD_001764a9_caseD_16:
      if (!bVar6) {
        (*(code *)((long)&switchD_00177fab::switchdataD_001c7860 +
                  (long)(int)(&switchD_00177fab::switchdataD_001c7860)[(long)pBVar22]))();
        return;
      }
code_r0x00177f7c:
      (*(code *)((long)&switchD_00177f8f::switchdataD_001c787c +
                (long)(int)(&switchD_00177f8f::switchdataD_001c787c)[(long)pBVar22]))();
      return;
    case '\x18':
      goto switchD_001764a9_caseD_18;
    default:
      if ((ulong)(long)(int)(&switchD_00175bbf::switchdataD_001c7834)[uVar44] < 0xffffffffffe387cc
          && !bVar6) goto code_r0x001c782a;
code_r0x001c783e:
      *(int *)((long)unaff_RBP + -10) = *(int *)((long)unaff_RBP + -10) + -1;
      out(uVar35,(char)pIVar30);
      piVar31 = (int *)((ulong)((int)unaff_RBP - 1) - 10);
      *piVar31 = *piVar31 + -1;
      piVar31 = (int *)((long)&impl[-0x27a39].uav_index_to_offset.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start + 6);
      *piVar31 = *piVar31 + 1;
      halt_baddata();
    }
    IVar11 = spv::Builder::makeFloatType(local_1050,iVar38);
    goto LAB_00176723;
  case 9:
    *pbVar27 = *pbVar27 + bVar7;
    Converter::Impl::fixup_load_type_typed
              (this_00,(ComponentType)pOVar23,4,(Value *)pBVar22,uStack_1040);
    pIVar41 = this_00;
code_r0x001766dd:
    build_exploded_composite_from_vector(pIVar41,(Instruction *)pBVar22,4);
    return;
  case 10:
    if (SCARRY8(uVar26,0x1c77fc) != (long)pbVar27 < 0) goto code_r0x001766dd;
    impl = (Impl *)CONCAT62((int6)((ulong)impl >> 0x10),(ushort)(byte)impl);
code_r0x001766be:
    width = (int)unaff_RBP;
    iVar38 = 0x10;
    this_03 = pBVar22;
LAB_00176719:
    IVar11 = spv::Builder::makeIntegerType(this_03,iVar38,false);
LAB_00176723:
    local_1068 = (Impl *)0x0;
    if (CONCAT44(IStack_102c,IStack_1030) != 0) {
      IVar11 = spv::Builder::makeVectorType(this_03,IVar11,width);
    }
    iVar38 = *(int *)((long)&(local_1060->sourceText).field_2 + 4);
    local_1038 = (Impl *)LLVMBC::Type::getStructElementType
                                   ((Type *)CONCAT44(uStack_1004,uStack_1008),0);
    TVar17 = LLVMBC::Type::getTypeID((Type *)local_1038);
    bVar9 = 1;
    if (TVar17 == IntegerTyID) {
      bVar6 = type_is_16bit((Type *)local_1038);
      if ((bVar6) && ((this_00->execution_mode_meta).native_16bit_operations == false)) {
        bVar9 = (this_00->options).min_precision_prefer_native_16bit;
      }
      else {
        bVar9 = 0;
      }
    }
    uVar44 = (uStack_1070 & 0x10) >> 4;
    uStack_1078._4_4_ = IVar11;
    TVar17 = LLVMBC::Type::getTypeID(uStack_1040);
    pBVar20 = local_1050;
    iStack_1028._M_len._0_4_ = (uint)bVar9;
    if (TVar17 == DoubleTyID) {
      iStack_1028._M_len._0_4_ = 0;
    }
    uStack_1008 = uVar44;
    if (((byte)uVar44 & iVar38 == 0xc) == 1) {
      p_Var28 = get_thread_log_callback();
      if (p_Var28 != (LoggingCallback)0x0) {
        uStack_fc8 = 0x636162;
        builtin_strncpy(acStack_fc5,"k. >:(\n",8);
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x61707320646e6120;
        uStack_fd0 = 0x657372;
        uStack_fcd = 0x6465656620;
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x7520746f6e6e6143;
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x734f425353206573;
        pvVar29 = get_thread_log_callback_userdata();
        (*p_Var28)(pvVar29,Error,(char *)&VStack_fe8);
        return;
      }
      emit_buffer_load_instruction();
      return;
    }
    if (iVar38 == 0xc) {
      IVar11 = spv::Builder::makePointer(local_1050,StorageClassStorageBuffer,uStack_1078._4_4_);
      uStack_1040 = (Type *)CONCAT44(uStack_1040._4_4_,IVar11);
      if ((int)impl != 0) {
        uVar26 = 0;
        do {
          if ((CONCAT44(IStack_102c,IStack_1030) == 0) &&
             ((*(uint *)CONCAT44(iStack_1028._M_array._4_4_,iStack_1028._M_array._0_4_) >>
               ((uint)uVar26 & 0x1f) & 1) == 0)) {
            IVar11 = spv::Builder::createUndefined(pBVar20,uStack_1078._4_4_);
          }
          else {
            pOVar23 = Converter::Impl::allocate(this_00,OpAccessChain,(Id)uStack_1040);
            Operation::add_id(pOVar23,local_1054);
            IVar11 = spv::Builder::makeIntegerType(pBVar20,0x20,false);
            IVar11 = spv::Builder::makeIntConstant(pBVar20,IVar11,0,false);
            Operation::add_id(pOVar23,IVar11);
            IVar11 = Converter::Impl::build_offset(this_00,(Id)uStack_1000,(uint)uVar26);
            Operation::add_id(pOVar23,IVar11);
            Converter::Impl::add(this_00,pOVar23,false);
            if ((local_1060->sourceText).field_2._M_local_buf[1] == '\x01') {
              spv::Builder::addDecoration(pBVar20,pOVar23->id,DecorationNonUniform,-1);
            }
            pOVar24 = Converter::Impl::allocate(this_00,OpLoad,uStack_1078._4_4_);
            Operation::add_id(pOVar24,pOVar23->id);
            Converter::Impl::add
                      (this_00,pOVar24,(bool)(local_1060->sourceText).field_2._M_local_buf[3]);
            IVar11 = pOVar24->id;
          }
          aIStack_1018[uVar26] = IVar11;
          uVar26 = uVar26 + 1;
        } while (((ulong)impl & 0xffffffff) != uVar26);
      }
      if (CONCAT44(IStack_102c,IStack_1030) != 0) {
        pVVar40 = (key_type)local_1038;
        pIVar41 = local_1048;
        IVar11 = aIStack_1018[0];
        goto LAB_00176ce9;
      }
    }
    else {
      bVar6 = spv::Builder::isStorageImageType(local_1050,IStack_1058);
      IVar11 = uStack_1078._4_4_;
      local_106c = CONCAT13(bVar6,(undefined3)local_106c);
      IStack_1058 = spv::Builder::makeVectorType(pBVar20,uStack_1078._4_4_,4);
      uVar26 = (ulong)local_1068;
      IVar15 = 0;
      iStack_1028._M_len._4_4_ = 0;
      if ((uStack_1070 & 0x10) != 0) {
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             VStack_fe8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start + 2;
        *VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start = IVar11;
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start[1] = IStack_1058;
        VStack_fe8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             VStack_fe8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        iStack_1028._M_len._4_4_ =
             Converter::Impl::get_struct_type(this_00,&VStack_fe8,0,"SparseTexel");
        if (VStack_fe8.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (Id *)0x0) {
          free_in_thread(VStack_fe8.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if ((int)uVar26 != 0) {
        uStack_1040 = (Type *)((ulong)local_1068 & 0xffffffff);
        bVar9 = 1;
        pTVar21 = (Type *)0x0;
        IVar15 = 0;
        do {
          if ((*(uint *)CONCAT44(iStack_1028._M_array._4_4_,iStack_1028._M_array._0_4_) >>
               ((uint)pTVar21 & 0x1f) & 1) == 0) {
            IVar11 = spv::Builder::makeIntegerType(pBVar20,0x20,false);
            IVar11 = spv::Builder::createUndefined(pBVar20,IVar11);
          }
          else {
            bVar9 = bVar9 & (byte)uStack_1008;
            IStack_1030 = CONCAT31(IStack_1030._1_3_,bVar9);
            OVar18 = OpImageRead;
            if (bVar9 != 0) {
              OVar18 = OpImageSparseRead;
            }
            IVar11 = IStack_1058;
            op = OpImageFetch;
            if (bVar9 != 0) {
              IVar11 = iStack_1028._M_len._4_4_;
              op = OpImageSparseFetch;
            }
            if (local_106c._3_1_ != '\0') {
              op = OVar18;
            }
            pOVar23 = Converter::Impl::allocate(this_00,op,IVar11);
            IStack_ff8 = local_1054;
            IStack_ff4 = Converter::Impl::build_offset(this_00,(Id)uStack_1000,(uint)pTVar21);
            VStack_fe8.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = &IStack_ff8;
            VStack_fe8.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (Id *)0x2;
            Operation::add_ids(pOVar23,(initializer_list<unsigned_int> *)&VStack_fe8);
            Converter::Impl::add
                      (this_00,pOVar23,(bool)(local_1060->sourceText).field_2._M_local_buf[3]);
            IVar13 = uStack_1078._4_4_;
            pOVar24 = Converter::Impl::allocate(this_00,OpCompositeExtract,uStack_1078._4_4_);
            Operation::add_id(pOVar24,pOVar23->id);
            Operation::add_literal(pOVar24,0);
            Converter::Impl::add(this_00,pOVar24,false);
            IVar11 = pOVar24->id;
            if ((char)IStack_1030 == '\x01') {
              pOVar24 = Converter::Impl::allocate(this_00,OpCompositeExtract,IVar13);
              Operation::add_id(pOVar24,pOVar23->id);
              Operation::add_literal(pOVar24,1);
              Operation::add_literal(pOVar24,0);
              Converter::Impl::add(this_00,pOVar24,false);
              IVar15 = IVar11;
              IVar11 = pOVar24->id;
            }
            bVar9 = 0;
            pBVar20 = local_1050;
          }
          aIStack_1018[(long)pTVar21] = IVar11;
          pTVar21 = (Type *)((long)&pTVar21->context + 1);
        } while (uStack_1040 != pTVar21);
      }
      if ((uStack_1070 & 0x10) != 0) {
        pOVar23 = Converter::Impl::allocate(this_00,OpCompositeConstruct,(Value *)local_1048);
        pVVar40 = (key_type)local_1038;
        if (((char)iStack_1028._M_len != '\0') && ((uint)local_1068 != 0)) {
          local_1060 = (Builder *)((ulong)local_1068 & 0xffffffff);
          pBVar20 = (Builder *)0x0;
          do {
            IVar11 = Converter::Impl::get_type_id(this_00,(Type *)pVVar40,0);
            pOVar24 = Converter::Impl::allocate(this_00,OpBitcast,IVar11);
            Operation::add_id(pOVar24,aIStack_1018[(long)pBVar20]);
            Converter::Impl::add(this_00,pOVar24,false);
            aIStack_1018[(long)pBVar20] = pOVar24->id;
            pBVar20 = (Builder *)((long)&pBVar20->_vptr_Builder + 1);
          } while (local_1060 != pBVar20);
        }
        if ((uint)local_1068 != 0) {
          uVar26 = (ulong)local_1068 & 0xffffffff;
          uVar42 = 0;
          do {
            Operation::add_id(pOVar23,aIStack_1018[uVar42]);
            uVar42 = uVar42 + 1;
          } while (uVar26 != uVar42);
        }
        pVVar40 = (key_type)local_1038;
        pBVar20 = local_1050;
        if ((uint)local_1068 < 4) {
          iVar38 = (uint)local_1068 - 4;
          do {
            IVar11 = Converter::Impl::get_type_id(this_00,(Type *)pVVar40,0);
            IVar11 = spv::Builder::createUndefined(pBVar20,IVar11);
            Operation::add_id(pOVar23,IVar11);
            iVar38 = iVar38 + 1;
          } while (iVar38 != 0);
        }
        Operation::add_id(pOVar23,IVar15);
        Converter::Impl::add(this_00,pOVar23,false);
        pIVar41 = local_1048;
        IVar11 = 0;
        goto LAB_00176ce9;
      }
    }
    IVar11 = Converter::Impl::build_vector(this_00,uStack_1078._4_4_,aIStack_1018,(uint)local_1068);
    pVVar40 = (key_type)local_1038;
    pIVar41 = local_1048;
LAB_00176ce9:
    if ((uStack_1070 & 0x10) == 0) {
      if ((char)iStack_1028._M_len != '\0') {
        bVar6 = type_is_16bit((Type *)pVVar40);
        if (((bVar6) && ((this_00->execution_mode_meta).native_16bit_operations == false)) &&
           ((this_00->options).min_precision_prefer_native_16bit == true)) {
          TVar17 = LLVMBC::Type::getTypeID((Type *)pVVar40);
          uVar44 = (uint)local_1068;
          if (TVar17 == HalfTyID) {
            IVar15 = Converter::Impl::get_type_id(this_00,F32,1,uVar44,false);
            pOVar23 = Converter::Impl::allocate(this_00,OpBitcast,IVar15);
            Operation::add_id(pOVar23,IVar11);
            Converter::Impl::add(this_00,pOVar23,false);
            IVar11 = pOVar23->id;
            IVar15 = Converter::Impl::get_type_id(this_00,F16,1,uVar44,false);
            OVar18 = OpFConvert;
          }
          else {
            IVar15 = Converter::Impl::get_type_id(this_00,U16,1,uVar44,false);
            OVar18 = OpUConvert;
          }
        }
        else {
          IVar15 = Converter::Impl::get_type_id(this_00,(Type *)pVVar40,0);
          IVar15 = Converter::Impl::build_vector_type(this_00,IVar15,(uint)local_1068);
          OVar18 = OpBitcast;
        }
        pOVar23 = Converter::Impl::allocate(this_00,OVar18,IVar15);
        Operation::add_id(pOVar23,IVar11);
        Converter::Impl::add(this_00,pOVar23,false);
        IVar11 = pOVar23->id;
      }
      Converter::Impl::rewrite_value(this_00,(Value *)pIVar41,IVar11);
      build_exploded_composite_from_vector(this_00,(Instruction *)pIVar41,(uint)local_1068);
    }
    *(undefined1 *)(CONCAT44(iStack_1028._M_array._4_4_,iStack_1028._M_array._0_4_) + 8) = 0;
    return;
  case 0xb:
    out(0xbe,iVar38);
    *pbVar27 = *pbVar27 & bVar7;
    *pbVar27 = *pbVar27 + bVar7;
    uVar37 = 0;
  case 0xc:
switchD_00175bbf_caseD_c:
    IVar11 = spv::Builder::makeIntegerType((Builder *)pIVar41,width,SUB81(uVar37,0));
    IVar11 = spv::Builder::makeIntConstant((Builder *)0x0,IVar11,(uint)this_00,false);
    uStack_1040 = (Type *)CONCAT44(uStack_1040._4_4_,IVar11);
    build_accumulate_offsets(local_1068,(Id *)&local_1048,3);
    bVar6 = (int)impl == 0;
switchD_001764a9_caseD_8:
    if (bVar6) {
      return;
    }
code_r0x00177706:
    (*(code *)((long)&switchD_001766ba::switchdataD_001c7850 +
              (long)(int)(&switchD_001766ba::switchdataD_001c7850)[(ulong)pBVar22 & 0xffffffff]))();
    return;
  case 0xd:
  case 0xe:
  case 0xf:
switchD_00175bbf_caseD_d:
    halt_baddata();
  case 0x10:
switchD_00175bbf_caseD_10:
    Operation::add_id((Operation *)this_00,(Id)pbVar27);
    Operation::add_id((Operation *)this_00,(Id)uStack_1040);
    Converter::Impl::add(impl,(Operation *)this_00,false);
    if ((pBVar20->sourceText).field_2._M_local_buf[1] == '\x01') {
      spv::Builder::addDecoration
                (pBVar22,*(Id *)((long)&this_00->bitcode_parser + 4),DecorationNonUniform,-1);
    }
    pOVar23 = Converter::Impl::allocate(impl,OpStore);
    Operation::add_id(pOVar23,*(Id *)((long)&this_00->bitcode_parser + 4));
    Operation::add_id(pOVar23,(Id)unaff_RBP);
    cVar10 = (pBVar20->sourceText).field_2._M_local_buf[3];
    pIVar41 = impl;
    goto code_r0x00177f1f;
  case 0x11:
    cVar10 = (char)extraout_RDX;
    *(short *)((ulong)(0x1c77fc -
                      *(int *)((ulong)(iVar38 + 0xf41fffb + (uint)(0xffffffffffe38803 < uVar26)) -
                              0x77)) * 5 + -0x1a) = (short)in_ST0;
code_r0x00177f1f:
    Converter::Impl::add(pIVar41,pOVar23,(bool)cVar10);
    goto LAB_001781c6;
  case 0x12:
    if (*(int *)((long)&(pBVar20->sourceText).field_2 + 4) != 0xc) {
      lVar43 = 0;
      pBVar22 = (Builder *)CONCAT44(local_1054,IStack_1058);
      local_1050 = pBVar20;
      IVar11 = spv::Builder::makeIntegerType(pBVar22,0x20,false);
      IVar11 = spv::Builder::makeVectorType(pBVar22,IVar11,4);
      puVar5 = (iterator)CONCAT44(iStack_1028._M_array._4_4_,iStack_1028._M_array._0_4_);
      local_1060 = (Builder *)CONCAT44(IVar11,(Id)local_1060);
      do {
        if (((uint)local_1048 >> ((uint)lVar43 & 0x1f) & 1) != 0) {
          iStack_1028._M_array = puVar5;
          pOVar23 = Converter::Impl::allocate(impl,OpCompositeConstruct,local_1060._4_4_);
          IStack_1030 = aIStack_1018[lVar43];
          iStack_1028._M_len._0_4_ = 4;
          iStack_1028._M_len._4_4_ = 0;
          IStack_102c = IStack_1030;
          local_1038._0_4_ = IStack_1030;
          local_1038._4_4_ = IStack_1030;
          iStack_1028._M_array = (iterator)&local_1038;
          Operation::add_ids(pOVar23,&iStack_1028);
          Converter::Impl::add(impl,pOVar23,false);
          pOVar24 = Converter::Impl::allocate(impl,OpImageWrite);
          local_1038 = (Impl *)CONCAT44(local_1038._4_4_,(Id)local_1060);
          IVar11 = Converter::Impl::build_offset(impl,(Id)uStack_1040,(uint)lVar43);
          local_1038 = (Impl *)CONCAT44(IVar11,(Id)local_1038);
          IStack_1030 = pOVar23->id;
          iStack_1028._M_len._0_4_ = 3;
          iStack_1028._M_len._4_4_ = 0;
          iStack_1028._M_array = (iterator)&local_1038;
          Operation::add_ids(pOVar24,&iStack_1028);
          Converter::Impl::add(impl,pOVar24,(bool)(local_1050->sourceText).field_2._M_local_buf[3]);
          puVar5 = iStack_1028._M_array;
        }
        iStack_1028._M_array._4_4_ = (undefined4)((ulong)puVar5 >> 0x20);
        lVar43 = lVar43 + 1;
      } while (lVar43 != 4);
      goto LAB_001781c6;
    }
code_r0x00177f4d:
    if (this_00 != (Impl *)0x0) {
      uVar44 = raw_width_to_bits(local_1060._4_4_);
      pBVar22 = (Builder *)CONCAT44(local_1054,IStack_1058);
      if ((Id)local_1050 == 4) {
        IVar11 = spv::Builder::makeFloatType(pBVar22,uVar44);
      }
      else {
        IVar11 = spv::Builder::makeIntegerType(pBVar22,uVar44,false);
      }
      uVar44 = (uint)this_00 + 1;
      IVar15 = spv::Builder::makeVectorType(pBVar22,IVar11,uVar44);
      IVar11 = Converter::Impl::build_vector(impl,IVar11,aIStack_1018,uVar44);
      unaff_RBP = (undefined8 *)(ulong)IVar11;
      pBVar22 = (Builder *)CONCAT44(local_1054,IStack_1058);
      IVar11 = spv::Builder::makePointer
                         ((Builder *)CONCAT44(local_1054,IStack_1058),StorageClassStorageBuffer,
                          IVar15);
      this_00 = (Impl *)Converter::Impl::allocate(impl,OpAccessChain,IVar11);
      Operation::add_id((Operation *)this_00,(Id)local_1060);
      IVar11 = spv::Builder::makeIntegerType(pBVar22,0x20,false);
      IVar11 = spv::Builder::makeIntConstant(pBVar22,IVar11,0,false);
      pbVar27 = (byte *)(ulong)IVar11;
      goto switchD_00175bbf_caseD_10;
    }
    pIVar30 = (Impl *)(ulong)CONCAT31((int3)((ulong)local_1060 >> 0x28),
                                      (char)((ulong)local_1060 >> 0x20) * '\x02' + '\x01');
    goto code_r0x00177f4c;
  case 0x13:
    uVar44 = iVar38 - 2;
    pcVar32 = (char *)(ulong)uVar44;
    *pcVar32 = *pcVar32 + (char)uVar44;
    *in_R8 = *in_R8 + (char)in_R8;
    puVar34 = (uint *)0x1c7773;
    uVar4 = (undefined3)(uVar44 >> 8);
    cVar10 = (char)uVar44 + *pcVar32;
    uVar44 = CONCAT31(uVar4,cVar10);
    anon_var_dwarf_28b549[10] = cVar10 + 'B';
    if (!SCARRY1(cVar10,'B')) {
      *(int *)(ulong)uVar44 = *(int *)(ulong)uVar44 + uVar44;
      puVar1 = &impl[0x493b].ags.instructions[4].immediate;
      *(char *)puVar1 = (char)*puVar1 + cVar10;
      bVar6 = (char)*puVar1 == '\0';
      goto switchD_001764a9_caseD_16;
    }
    pIVar30 = (Impl *)((ulong)CONCAT31(uVar4,cVar10) | 0xf);
code_r0x00177f4c:
    *(char *)((long)unaff_RBP + -0x7b) = *(char *)((long)unaff_RBP + -0x7b) + (char)puVar34;
    cVar10 = *(char *)&pIVar30->bitcode_parser;
    pcVar32 = impl[0x1ef].options.shader_source_file.field_2._M_local_buf + 0xc;
    *pcVar32 = *pcVar32 + (char)puVar34;
    unaff_RBP = (undefined8 *)0x0;
    pIVar33 = local_1048;
    pBVar22 = (Builder *)(ulong)((byte)((char)pIVar30 + cVar10) - 1);
switchD_001764a9_caseD_18:
    do {
      if (((uint)pIVar33 >> ((uint)unaff_RBP & 0x1f) & 1) != 0) goto code_r0x00177f75;
      unaff_RBP = (undefined8 *)((long)unaff_RBP + 1);
      pIVar33 = local_1048;
    } while (unaff_RBP != (undefined8 *)0x4);
LAB_001781c6:
    if (local_1068._7_1_ == '\n') {
      iStack_1028._M_array._0_4_ = 0x38;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)(CONCAT44(local_1054,IStack_1058) + 0xa8),(Capability *)&iStack_1028);
    }
    return;
  default:
    halt_baddata();
  }
  uVar36 = 0;
  uVar44 = 0;
  do {
    uVar2 = uVar36 & 0x1f;
    uVar36 = uVar36 + 1;
    if (((uint)pBVar22 >> uVar2 & 1) != 0) {
      uVar44 = uVar36;
    }
  } while (uVar36 != 4);
  IVar11 = spv::Builder::makeIntegerType(local_1060,0x20,false);
  IVar13 = spv::Builder::makeIntConstant(this,IVar11,uVar44 * iVar38 >> 3,false);
LAB_00175c14:
  cVar10 = *(char *)&this_00->bitcode_parser;
  pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,2);
  IVar15 = Converter::Impl::get_id_for_value(impl,pVVar19,0);
  pBVar20 = local_1060;
  if (cVar10 == '\n') {
    IVar11 = (Id)(this_00->bb_map)._M_h._M_element_count;
    local_106c = 0;
    IVar13 = IVar11;
  }
  else {
    local_106c = IVar15;
    if (cVar10 == '\v') {
      IVar11 = 0;
      IVar15 = 0;
    }
    else if (cVar10 == '\f') {
      pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,3);
      pVVar19 = LLVMBC::Internal::resolve_proxy(pVVar19);
      VVar12 = LLVMBC::Value::get_value_kind(pVVar19);
      IVar16 = 0;
      if (VVar12 != Undef) {
        pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,3);
        IVar16 = Converter::Impl::get_id_for_value(impl,pVVar19,0);
      }
      pBVar20 = local_1060;
      uVar44 = *(uint *)&this_00->bitcode_reflection_parser;
      IVar11 = spv::Builder::makeIntegerType(local_1060,0x20,false);
      IVar11 = spv::Builder::makeIntConstant(pBVar20,IVar11,uVar44,false);
      IVar15 = local_106c;
      local_106c = IVar16;
    }
    else {
      IVar11 = spv::Builder::makeIntegerType(local_1060,0x20,false);
      IVar11 = spv::Builder::makeIntConstant(pBVar20,IVar11,0x10,false);
      IVar15 = local_106c;
      local_106c = 0;
      IVar13 = IVar11;
    }
  }
LAB_00175909:
  if (IVar15 == 0) {
    IVar11 = 0;
  }
  else {
    IVar16 = spv::Builder::makeIntegerType(local_1060,0x20,false);
    pOVar23 = Converter::Impl::allocate(impl,OpIMul,IVar16);
    Operation::add_id(pOVar23,IVar15);
    Operation::add_id(pOVar23,IVar11);
    Converter::Impl::add(impl,pOVar23,false);
    IVar11 = pOVar23->id;
  }
  pBVar20 = local_1060;
  IVar16 = local_106c;
  local_1050 = (Builder *)CONCAT44(local_1050._4_4_,IVar13);
  IVar13 = local_106c;
  local_1054 = IVar15;
  if ((IVar11 != 0) && (IVar13 = IVar11, local_106c != 0)) {
    IVar15 = spv::Builder::makeIntegerType(local_1060,0x20,false);
    pOVar23 = Converter::Impl::allocate(impl,OpIAdd,IVar15);
    Operation::add_id(pOVar23,IVar11);
    Operation::add_id(pOVar23,IVar16);
    Converter::Impl::add(impl,pOVar23,false);
    IVar13 = pOVar23->id;
  }
  local_106c = IVar13;
  IVar11 = SPIRVModule::get_helper_call_id(impl->spirv_module,ValidateBDALoadStore,0);
  IVar15 = spv::Builder::makeBoolType(pBVar20);
  pOVar23 = Converter::Impl::allocate(impl,OpFunctionCall,IVar15);
  Operation::add_id(pOVar23,IVar11);
  IVar11 = *(Id *)((long)&(this_00->bb_map)._M_h._M_before_begin._M_nxt + 4);
  if (IVar11 == 0) {
    pVVar19 = LLVMBC::Instruction::getOperand((Instruction *)local_1068,1);
    IVar11 = Converter::Impl::get_id_for_value(impl,pVVar19,0);
  }
  Operation::add_id(pOVar23,IVar11);
  IVar11 = local_106c;
  Operation::add_id(pOVar23,local_106c);
  Operation::add_id(pOVar23,(Id)local_1050);
  IVar15 = spv::Builder::makeIntegerType(pBVar20,0x20,false);
  IVar15 = spv::Builder::makeIntConstant(pBVar20,IVar15,local_1050._4_4_,false);
  Operation::add_id(pOVar23,IVar15);
  IVar15 = spv::Builder::makeIntegerType(pBVar20,0x20,false);
  pOVar24 = Converter::Impl::allocate(impl,OpLoad,IVar15);
  Operation::add_id(pOVar24,(impl->instrumentation).invocation_id_var_id);
  Converter::Impl::add(impl,pOVar24,false);
  Operation::add_id(pOVar23,pOVar24->id);
  if (*(int *)((long)&(this_00->bb_map)._M_h._M_element_count + 4) == 0) {
    IVar11 = spv::Builder::makeBoolConstant(pBVar20,true,false);
  }
  else {
    IVar15 = spv::Builder::makeBoolType(pBVar20);
    pOVar24 = Converter::Impl::allocate(impl,OpULessThan,IVar15);
    if (*(char *)&this_00->bitcode_parser == '\n') {
      IVar11 = local_1054;
    }
    Operation::add_id(pOVar24,IVar11);
    Operation::add_id(pOVar24,*(Id *)((long)&(this_00->bb_map)._M_h._M_element_count + 4));
    Converter::Impl::add(impl,pOVar24,false);
    IVar11 = pOVar24->id;
  }
  Operation::add_id(pOVar23,IVar11);
  Converter::Impl::add(impl,pOVar23,false);
  pOVar24 = Converter::Impl::allocate(impl,OpAssumeTrueKHR);
  Operation::add_id(pOVar24,pOVar23->id);
  Converter::Impl::add(impl,pOVar24,false);
  return;
}

Assistant:

void emit_buffer_synchronization_validation(Converter::Impl &impl,
                                            const llvm::CallInst *instruction,
                                            BDAOperation bda_operation)
{
	if (!impl.options.instruction_instrumentation.enabled ||
	    impl.options.instruction_instrumentation.type != InstructionInstrumentationType::BufferSynchronizationValidation)
	{
		return;
	}

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[image_id];

	if (meta.storage != spv::StorageClassPhysicalStorageBuffer && meta.instrumentation.bda_id == 0)
		return;

	auto &builder = impl.builder();
	spv::Id stride_id = 0;
	spv::Id offset_id = 0;
	spv::Id elem_id = 0;
	spv::Id len_id = 0;

	if (bda_operation == BDAOperation::Store || bda_operation == BDAOperation::Load)
	{
		const llvm::Type *element_type;
		if (bda_operation == BDAOperation::Store)
			element_type = instruction->getOperand(4)->getType();
		else
			element_type = instruction->getType()->getStructElementType(0);

		if (meta.kind == DXIL::ResourceKind::RawBuffer || meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			unsigned mask;

			if (bda_operation == BDAOperation::Load)
			{
				auto &access_meta = impl.llvm_composite_meta[instruction];
				mask = access_meta.access_mask & 0xf;
			}
			else
			{
				mask = llvm::cast<llvm::ConstantInt>(instruction->getOperand(8))->getUniqueInteger().getZExtValue();
			}

			unsigned width = raw_width_to_bits(get_buffer_access_bits_per_component(impl, meta.storage, element_type));

			unsigned num_elems = 0;
			for (unsigned i = 0; i < 4; i++)
				if ((mask & (1u << i)) != 0)
					num_elems = i + 1;

			len_id = builder.makeUintConstant(num_elems * width / 8);
		}

		if (meta.kind == DXIL::ResourceKind::RawBuffer)
		{
			offset_id = impl.get_id_for_value(instruction->getOperand(2));
		}
		else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(3)))
				offset_id = impl.get_id_for_value(instruction->getOperand(3));
			stride_id = builder.makeUintConstant(meta.stride);
		}
		else if (meta.kind == DXIL::ResourceKind::TypedBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			stride_id = meta.instrumentation.elem_size_id;
			len_id = meta.instrumentation.elem_size_id;
		}
		else
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			stride_id = builder.makeUintConstant(16);
			len_id = stride_id;
		}
	}
	else
	{
		unsigned elem_index;

		if (value_is_dx_op_instrinsic(instruction, DXIL::Op::AtomicCompareExchange))
			elem_index = 2;
		else
			elem_index = 3;

		if (meta.kind == DXIL::ResourceKind::RawBuffer)
		{
			offset_id = impl.get_id_for_value(instruction->getOperand(elem_index));
		}
		else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(elem_index));
			if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(elem_index + 1)))
				offset_id = impl.get_id_for_value(instruction->getOperand(elem_index + 1));
			stride_id = builder.makeUintConstant(meta.stride);
		}
		else if (meta.kind == DXIL::ResourceKind::TypedBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(elem_index));
			stride_id = meta.instrumentation.elem_size_id;
		}

		len_id = builder.makeUintConstant(instruction->getType()->getIntegerBitWidth() / 8);
	}

	spv::Id total_offset_id = 0;

	if (elem_id != 0)
	{
		auto *mul = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		mul->add_id(elem_id);
		mul->add_id(stride_id);
		impl.add(mul);
		total_offset_id = mul->id;
	}

	if (!total_offset_id)
	{
		total_offset_id = offset_id;
	}
	else if (offset_id != 0)
	{
		auto *add = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
		add->add_id(total_offset_id);
		add->add_id(offset_id);
		impl.add(add);
		total_offset_id = add->id;
	}

	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::ValidateBDALoadStore);
	auto *call = impl.allocate(spv::OpFunctionCall, builder.makeBoolType());
	call->add_id(call_id);
	call->add_id(meta.instrumentation.bda_id ? meta.instrumentation.bda_id : impl.get_id_for_value(instruction->getOperand(1)));
	call->add_id(total_offset_id);
	call->add_id(len_id);
	call->add_id(builder.makeUintConstant(unsigned(bda_operation)));

	auto *load_invocation_id = impl.allocate(spv::OpLoad, builder.makeUintType(32));
	load_invocation_id->add_id(impl.instrumentation.invocation_id_var_id);
	impl.add(load_invocation_id);

	call->add_id(load_invocation_id->id);

	if (meta.instrumentation.resource_size_id)
	{
		auto *in_bounds = impl.allocate(spv::OpULessThan, builder.makeBoolType());

		if (meta.kind == DXIL::ResourceKind::TypedBuffer)
			in_bounds->add_id(elem_id);
		else
			in_bounds->add_id(total_offset_id);
		in_bounds->add_id(meta.instrumentation.resource_size_id);

		impl.add(in_bounds);
		call->add_id(in_bounds->id);
	}
	else
	{
		call->add_id(builder.makeBoolConstant(true));
	}

	impl.add(call);

	auto *expect_true = impl.allocate(spv::OpAssumeTrueKHR);
	expect_true->add_id(call->id);
	impl.add(expect_true);
}